

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  int iVar1;
  uint uVar2;
  TidyTagId TVar3;
  Lexer *pLVar4;
  Bool BVar5;
  Node *pNVar6;
  Dict *pDVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  Node **ppNVar11;
  char *property;
  long lVar12;
  bool bVar13;
  
  pLVar4 = doc->lexer;
  if (list == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    if ((long)iVar1 < 0) {
      bVar13 = false;
      list = (Node *)0x0;
    }
    else {
      list = (doc->stack).content[iVar1].original_node;
      (doc->stack).top = iVar1 + -1;
      bVar13 = false;
    }
  }
  else {
    pDVar7 = list->tag;
    if (pDVar7 == (Dict *)0x0) {
      bVar13 = false;
    }
    else {
      bVar13 = pDVar7->id == TidyTag_OL;
    }
    if ((pDVar7->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  pLVar4->insert = (IStack *)0x0;
  pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
  do {
    if (pNVar6 == (Node *)0x0) {
      prvTidyReport(doc,list,(Node *)0x0,0x25a);
      return (Node *)0x0;
    }
    if ((pNVar6->tag == list->tag) && (pNVar6->type == EndTag)) {
      prvTidyFreeNode(doc,pNVar6);
      list->closed = yes;
      return (Node *)0x0;
    }
    BVar5 = InsertMisc(list,pNVar6);
    if (BVar5 == no) {
      if (pNVar6->type == TextNode) {
        uVar2 = pNVar6->start;
        if (uVar2 < pNVar6->end) {
          lVar12 = 0;
          do {
            if ((0x20 < (ulong)(byte)pLVar4->lexbuf[lVar12 + (ulong)uVar2]) ||
               ((0x100002600U >> ((ulong)(byte)pLVar4->lexbuf[lVar12 + (ulong)uVar2] & 0x3f) & 1) ==
                0)) {
              pDVar7 = pNVar6->tag;
              goto LAB_0013b1c0;
            }
            lVar12 = lVar12 + 1;
          } while (pNVar6->end - uVar2 != (int)lVar12);
        }
      }
      else {
        pDVar7 = pNVar6->tag;
        if (pDVar7 != (Dict *)0x0) {
LAB_0013b1c0:
          if (pNVar6->type != EndTag) {
            pNVar9 = pNVar6;
            if (pDVar7 == (Dict *)0x0) {
              if (!bVar13) {
                bVar13 = false;
                goto LAB_0013b337;
              }
            }
            else {
              TVar3 = pDVar7->id;
              if (!(bool)(TVar3 != TidyTag_LI & bVar13)) {
                bVar13 = false;
                goto LAB_0013b32e;
              }
            }
            pNVar8 = list->content;
            if (pNVar8 == (Node *)0x0) {
              bVar13 = false;
            }
            else {
              pNVar10 = (Node *)0x0;
              do {
                if (((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_LI)) &&
                   (pNVar8->type == StartTag)) {
                  pNVar10 = pNVar8;
                }
                pNVar8 = pNVar8->next;
              } while (pNVar8 != (Node *)0x0);
              bVar13 = pNVar10 != (Node *)0x0;
            }
            if (pDVar7 == (Dict *)0x0) {
LAB_0013b337:
              BVar5 = prvTidyIsHTML5Mode(doc);
              if ((BVar5 == no) || (bVar13)) {
                prvTidyUngetToken(doc);
                BVar5 = prvTidynodeHasCM(pNVar6,8);
                if ((BVar5 != no) && (pLVar4->excludeBlocks != no)) {
                  prvTidyReport(doc,list,pNVar6,0x259);
                  return (Node *)0x0;
                }
                if (pLVar4->exiled != no) {
                  BVar5 = prvTidynodeHasCM(pNVar6,0x380);
                  if (BVar5 != no) {
                    return (Node *)0x0;
                  }
                  if ((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TidyTag_TABLE)) {
                    return (Node *)0x0;
                  }
                }
                if ((((list != (Node *)0x0) && (list->tag != (Dict *)0x0)) &&
                    (list->tag->id == TidyTag_OL)) &&
                   (pNVar8 = list->content, pNVar8 != (Node *)0x0)) {
                  pNVar9 = (Node *)0x0;
                  pNVar10 = (Node *)0x0;
                  do {
                    if (((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_LI)) &&
                       (pNVar8->type == StartTag)) {
                      pNVar10 = pNVar8;
                      pNVar9 = pNVar8;
                    }
                    pNVar8 = pNVar8->next;
                  } while (pNVar8 != (Node *)0x0);
                  if (pNVar10 != (Node *)0x0) {
                    pNVar6 = prvTidyInferredTag(doc,TidyTag_LI);
                    prvTidyReport(doc,list,pNVar6,0x261);
                    prvTidyFreeNode(doc,pNVar6);
                    goto LAB_0013b4ba;
                  }
                }
                BVar5 = prvTidynodeHasCM(pNVar6,8);
                pNVar9 = prvTidyInferredTag(doc,TidyTag_LI);
                property = "list-style: none; display: inline";
                if (BVar5 == no) {
                  property = "list-style: none";
                }
                prvTidyAddStyleProperty(doc,pNVar9,property);
                prvTidyReport(doc,list,pNVar9,0x261);
              }
            }
            else {
              TVar3 = pDVar7->id;
LAB_0013b32e:
              if (TVar3 != TidyTag_LI) goto LAB_0013b337;
            }
            pNVar9->parent = list;
            if (list == (Node *)0x0) {
              pNVar9->prev = (Node *)0x0;
            }
            else {
              pNVar6 = list->last;
              pNVar9->prev = pNVar6;
              ppNVar11 = &pNVar6->next;
              if (pNVar6 == (Node *)0x0) {
                ppNVar11 = &list->content;
              }
              *ppNVar11 = pNVar9;
              list->last = pNVar9;
            }
LAB_0013b4ba:
            prvTidypushMemory(doc,(TidyParserMemory)
                                  ZEXT2448(CONCAT816(pNVar9,CONCAT88(list,prvTidyParseList))));
            return pNVar9;
          }
          if ((pDVar7 == (Dict *)0x0) || (pDVar7->id != TidyTag_FORM)) {
            BVar5 = prvTidynodeHasCM(pNVar6,0x10);
            pNVar9 = list;
            if (BVar5 != no) {
              prvTidyReport(doc,list,pNVar6,0x235);
              prvTidyPopInline(doc,pNVar6);
              goto LAB_0013b225;
            }
            while ((pNVar9 = pNVar9->parent, pNVar9 != (Node *)0x0 &&
                   ((pDVar7 = pNVar9->tag, pDVar7 == (Dict *)0x0 || (pDVar7->id != TidyTag_BODY)))))
            {
              if (pNVar6->tag == pDVar7) {
                prvTidyReport(doc,list,pNVar6,0x259);
                prvTidyUngetToken(doc);
                return (Node *)0x0;
              }
            }
          }
          else {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
          }
        }
        prvTidyReport(doc,list,pNVar6,0x235);
      }
LAB_0013b225:
      prvTidyFreeNode(doc,pNVar6);
    }
    pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
  } while( true );
}

Assistant:

Node* TY_(ParseList)( TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    Node *lastli = NULL;;
    Bool wasblock = no;
    Bool nodeisOL = nodeIsOL(list);
    DEBUG_LOG_COUNTERS;

    if ( list == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        list = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(list);

        if (list->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        Bool foundLI = no;
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        if (lexer && (node->type == TextNode))
        {
            uint ch, ix = node->start;
            /* Issue #572 - Skip whitespace. */
            while (ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && (ch == ' ' || ch == '\t' || ch == '\r' || ch == '\n'))
                ++ix;
            if (ix >= node->end)
            {
                /* Issue #572 - Discard if ALL whitespace. */
                TY_(FreeNode)(doc, node);
                continue;
            }
        }


        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }

            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) && nodeisOL )
        {
            /* Issue #572 - A <ol><li> can have nested <ol> elements */
            foundLI = FindLastLI(list, &lastli); /* find last <li> */
        }

        if ( nodeIsLI(node) || (TY_(IsHTML5Mode)(doc) && !foundLI) )
        {
            /* node is <LI> OR
               Issue #396 - A <ul> can have Zero or more <li> elements
             */
            TY_(InsertNodeAtEnd)(list,node);
        }
        else
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                DEBUG_LOG_EXIT;
                return NULL;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
            {
                DEBUG_LOG_EXIT;
                return NULL;
            }
            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within
               the last <li> to preserve the numbering to match the visual
               rendering of most browsers. */
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none"
                                       );
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }

        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseList);
            memory.original_node = list;
            memory.reentry_node = node;
            memory.mode = IgnoreWhitespace;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}